

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

QPainterPath __thiscall
QPainterPathStroker::createStroke(QPainterPathStroker *this,QPainterPath *path)

{
  long lVar1;
  QStroker *stroker;
  bool bVar2;
  long lVar3;
  QPainterPath *in_RDX;
  qreal *pqVar4;
  QTransform *pQVar5;
  QDashStroker *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  QPainterPath stroke;
  QTransform local_130;
  QDashStroker dashStroker;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  stroker = (QStroker *)(path->d_ptr).d.ptr;
  stroke.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath(&stroke);
  bVar2 = QPainterPath::isEmpty(in_RDX);
  if (!bVar2) {
    if (stroker[1].super_QStrokerOps.m_elements.siz == 0) {
      pqVar4 = (qreal *)&DAT_005ef4e8;
      pQVar6 = &dashStroker;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pQVar6->super_QStrokerOps)._vptr_QStrokerOps = (_func_int **)*pqVar4;
        pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
        pQVar6 = (QDashStroker *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      dashStroker.super_QStrokerOps.m_dashThreshold._0_2_ = 0;
      QStrokerOps::strokePath((QStrokerOps *)stroker,in_RDX,&stroke,(QTransform *)&dashStroker);
    }
    else {
      memcpy(&dashStroker,&DAT_005ef440,0xa8);
      QDashStroker::QDashStroker(&dashStroker,stroker);
      QArrayDataPointer<double>::operator=
                (&dashStroker.m_dashPattern.d,(QArrayDataPointer<double> *)(stroker + 1));
      dashStroker.m_dashOffset = (qreal)stroker[1].super_QStrokerOps.m_elements.buffer;
      dashStroker.super_QStrokerOps.m_clip_rect.xp = (stroker->super_QStrokerOps).m_clip_rect.xp;
      dashStroker.super_QStrokerOps.m_clip_rect.yp = (stroker->super_QStrokerOps).m_clip_rect.yp;
      dashStroker.super_QStrokerOps.m_clip_rect.w = (stroker->super_QStrokerOps).m_clip_rect.w;
      dashStroker.super_QStrokerOps.m_clip_rect.h = (stroker->super_QStrokerOps).m_clip_rect.h;
      pqVar4 = (qreal *)&DAT_005ef4e8;
      pQVar5 = &local_130;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        pQVar5->m_matrix[0][0] = *pqVar4;
        pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
        pQVar5 = (QTransform *)((long)pQVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      }
      local_130._72_2_ = 0;
      QStrokerOps::strokePath(&dashStroker.super_QStrokerOps,in_RDX,&stroke,&local_130);
      QDashStroker::~QDashStroker(&dashStroker);
    }
    QPainterPath::setFillRule(&stroke,WindingFill);
    in_RDX = &stroke;
  }
  QPainterPath::QPainterPath((QPainterPath *)this,in_RDX);
  QPainterPath::~QPainterPath(&stroke);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
}

Assistant:

QPainterPath QPainterPathStroker::createStroke(const QPainterPath &path) const
{
    QPainterPathStrokerPrivate *d = const_cast<QPainterPathStrokerPrivate *>(d_func());
    QPainterPath stroke;
    if (path.isEmpty())
        return path;
    if (d->dashPattern.isEmpty()) {
        d->stroker.strokePath(path, &stroke, QTransform());
    } else {
        QDashStroker dashStroker(&d->stroker);
        dashStroker.setDashPattern(d->dashPattern);
        dashStroker.setDashOffset(d->dashOffset);
        dashStroker.setClipRect(d->stroker.clipRect());
        dashStroker.strokePath(path, &stroke, QTransform());
    }
    stroke.setFillRule(Qt::WindingFill);
    return stroke;
}